

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *local_30;
  char *local_28;
  char *local_20;
  PolicyID local_14;
  string *psStack_10;
  PolicyID id_local;
  
  local_14 = (PolicyID)this;
  psStack_10 = __return_storage_ptr__;
  local_20 = idToString(local_14);
  local_28 = idToShortDescription(local_14);
  local_30 = idToString(local_14);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[14],char_const*,char_const(&)[28],char_const*,char_const(&)[97]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",&local_20,(char (*) [14])0xfe3641,
             &local_28,(char (*) [28])"  Run \"cmake --help-policy ",&local_30,
             (char (*) [97])
             "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  return cmStrCat("Policy ", idToString(id),
                  " is not set: ", idToShortDescription(id),
                  "  "
                  "Run \"cmake --help-policy ",
                  idToString(id),
                  "\" for "
                  "policy details.  "
                  "Use the cmake_policy command to set the policy "
                  "and suppress this warning.");
}